

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void __thiscall duckdb::Vector::Slice(Vector *this,Vector *other,idx_t offset,idx_t end)

{
  LogicalType *other_00;
  PhysicalType type;
  data_ptr_t pdVar1;
  undefined1 auVar2 [16];
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference this_02;
  pointer this_03;
  const_reference this_04;
  type other_01;
  Vector *this_05;
  Vector *other_02;
  ulong uVar3;
  size_type __n;
  int iVar4;
  idx_t iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  Vector new_vector;
  Vector local_c8;
  LogicalType local_60;
  LogicalType local_48;
  long lVar8;
  
  if (other->vector_type == FLAT_VECTOR) {
    other_00 = &this->type;
    type = (this->type).physical_type_;
    if (type == ARRAY) {
      LogicalType::LogicalType(&local_60,other_00);
      Vector(&local_c8,&local_60,0x800);
      LogicalType::~LogicalType(&local_60);
      this_05 = ArrayVector::GetEntryInternal<duckdb::Vector>(&local_c8);
      other_02 = ArrayVector::GetEntryInternal<duckdb::Vector_const>(other);
      iVar5 = ArrayType::GetSize(other_00);
      Slice(this_05,other_02,iVar5 * offset,iVar5 * end);
      ValidityMask::Slice(&local_c8.validity,&other->validity,offset,end - offset);
      Reference(this,&local_c8);
    }
    else {
      if (type != STRUCT) {
        Reference(this,other);
        if (offset == 0) {
          return;
        }
        pdVar1 = this->data;
        iVar5 = GetTypeIdSize(type);
        this->data = pdVar1 + iVar5 * offset;
        ValidityMask::Slice(&this->validity,&other->validity,offset,end - offset);
        return;
      }
      LogicalType::LogicalType(&local_48,other_00);
      Vector(&local_c8,&local_48,0x800);
      LogicalType::~LogicalType(&local_48);
      this_00 = StructVector::GetEntries(&local_c8);
      this_01 = StructVector::GetEntries(other);
      if ((this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_00,__n);
          this_03 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->(this_02);
          this_04 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_01,__n);
          other_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(this_04);
          Slice(this_03,other_01,offset,end);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this_00->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      ValidityMask::Slice(&local_c8.validity,&other->validity,offset,end - offset);
      Reference(this,&local_c8);
    }
    if (local_c8.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c8.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_c8.type);
  }
  else {
    if (other->vector_type == CONSTANT_VECTOR) {
      Reference(this,other);
      return;
    }
    SelectionVector::SelectionVector((SelectionVector *)&local_c8,end - offset);
    auVar2 = _DAT_01d9fb10;
    iVar5 = end - offset;
    if (iVar5 != 0) {
      lVar8 = iVar5 - 1;
      auVar6._8_4_ = (int)lVar8;
      auVar6._0_8_ = lVar8;
      auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar3 = 0;
      auVar6 = auVar6 ^ _DAT_01d9fb10;
      auVar7 = _DAT_01d9fb00;
      do {
        auVar9 = auVar7 ^ auVar2;
        iVar4 = (int)offset;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          *(int *)(local_c8._0_8_ + uVar3 * 4) = iVar4;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          *(int *)(local_c8._0_8_ + (uVar3 + 1) * 4) = iVar4 + 1;
        }
        uVar3 = uVar3 + 2;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        offset = (idx_t)(iVar4 + 2);
      } while ((iVar5 + 1 & 0xfffffffffffffffe) != uVar3);
    }
    Reference(this,other);
    Slice(this,(SelectionVector *)&local_c8,iVar5);
    if (local_c8.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return;
}

Assistant:

void Vector::Slice(const Vector &other, idx_t offset, idx_t end) {
	D_ASSERT(end >= offset);
	if (other.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		Reference(other);
		return;
	}
	if (other.GetVectorType() != VectorType::FLAT_VECTOR) {
		// we can slice the data directly only for flat vectors
		// for non-flat vectors slice using a selection vector instead
		idx_t count = end - offset;
		SelectionVector sel(count);
		for (idx_t i = 0; i < count; i++) {
			sel.set_index(i, offset + i);
		}
		Slice(other, sel, count);
		return;
	}

	auto internal_type = GetType().InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		Vector new_vector(GetType());
		auto &entries = StructVector::GetEntries(new_vector);
		auto &other_entries = StructVector::GetEntries(other);
		D_ASSERT(entries.size() == other_entries.size());
		for (idx_t i = 0; i < entries.size(); i++) {
			entries[i]->Slice(*other_entries[i], offset, end);
		}
		new_vector.validity.Slice(other.validity, offset, end - offset);
		Reference(new_vector);
	} else if (internal_type == PhysicalType::ARRAY) {
		Vector new_vector(GetType());
		auto &child_vec = ArrayVector::GetEntry(new_vector);
		auto &other_child_vec = ArrayVector::GetEntry(other);
		D_ASSERT(ArrayType::GetSize(GetType()) == ArrayType::GetSize(other.GetType()));
		const auto array_size = ArrayType::GetSize(GetType());
		// We need to slice the child vector with the multiplied offset and end
		child_vec.Slice(other_child_vec, offset * array_size, end * array_size);
		new_vector.validity.Slice(other.validity, offset, end - offset);
		Reference(new_vector);
	} else {
		Reference(other);
		if (offset > 0) {
			data = data + GetTypeIdSize(internal_type) * offset;
			validity.Slice(other.validity, offset, end - offset);
		}
	}
}